

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall ThreadPool::ThreadPool(ThreadPool *this,int threads)

{
  type local_30;
  int local_28;
  int i;
  int local_14;
  ThreadPool *pTStack_10;
  int threads_local;
  ThreadPool *this_local;
  
  this->_vptr_ThreadPool = (_func_int **)&PTR__ThreadPool_003020a8;
  this->_stop = false;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_14 = threads;
  pTStack_10 = this;
  std::mutex::mutex(&this->_mutex);
  std::condition_variable::condition_variable(&this->_cond);
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->_threads);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->_tasks);
  if (local_14 < 1) {
    local_14 = get_thread_count();
  }
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    local_30.this = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<ThreadPool::ThreadPool(int)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->_threads,&local_30);
  }
  return;
}

Assistant:

inline ThreadPool::ThreadPool(int threads)
    : _stop(false)
{
    if (threads <= 0)
        threads = get_thread_count();

    for (auto i = 0; i < threads; ++i)
    {
        _threads.emplace_back([this]() {
            for (;;)
            {
                std::function<void()> task;

                std::unique_lock<std::mutex> lock(_mutex);
                _cond.wait(lock, [this] { return _stop || !_tasks.empty(); });

                if (_stop && _tasks.empty())
                    break;

                task = std::move(_tasks.front());
                _tasks.pop();
                lock.unlock();

                task();
            }
            });
    }
}